

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_scan.c
# Opt level: O1

int GET(_PDCLIB_status_t *status)

{
  _PDCLIB_file_t *p_Var1;
  unsigned_long uVar2;
  int iVar3;
  uint uVar4;
  uchar *puVar5;
  
  p_Var1 = status->stream;
  if (p_Var1 == (_PDCLIB_file_t *)0x0) {
    puVar5 = (uchar *)status->s;
    if (*puVar5 == 0) {
LAB_001056be:
      uVar4 = 0xffffffff;
      goto LAB_001056af;
    }
    status->s = (char *)(puVar5 + 1);
  }
  else {
    if ((p_Var1->bufidx == p_Var1->bufend) && (p_Var1->ungetidx == 0)) {
      iVar3 = _PDCLIB_fillbuffer(p_Var1);
      if (iVar3 == -1) goto LAB_001056be;
    }
    p_Var1 = status->stream;
    uVar2 = p_Var1->ungetidx;
    if (uVar2 == 0) {
      uVar2 = p_Var1->bufidx;
      p_Var1->bufidx = uVar2 + 1;
      puVar5 = (uchar *)(p_Var1->buffer + uVar2);
    }
    else {
      p_Var1->ungetidx = uVar2 - 1;
      puVar5 = p_Var1->ungetbuf + (uVar2 - 1);
    }
  }
  uVar4 = (uint)*puVar5;
LAB_001056af:
  if (uVar4 != 0xffffffff) {
    status->i = status->i + 1;
    status->current = status->current + 1;
  }
  return uVar4;
}

Assistant:

static int GET( struct _PDCLIB_status_t * status )
{
    int rc = EOF;

    if ( status->stream != NULL )
    {
        if ( _PDCLIB_CHECKBUFFER( status->stream ) != EOF )
        {
            rc = _PDCLIB_GETC( status->stream );
        }
    }
    else
    {
        rc = ( *status->s == '\0' ) ? EOF : ( unsigned char ) * ( ( status->s )++ );
    }

    if ( rc != EOF )
    {
        ++( status->i );
        ++( status->current );
    }

    return rc;
}